

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ibuf.c
# Opt level: O1

int main(void)

{
  int iVar1;
  int extraout_EAX;
  char *pcVar2;
  void *pvVar3;
  char *pcVar4;
  size_t extraout_RDX;
  uint uVar5;
  slab_cache *psVar6;
  long lVar7;
  ibuf *ibuf;
  ulong uVar8;
  ibuf local_60;
  
  plan(6);
  _space(_stdout);
  printf("# *** %s ***\n","main");
  quota.value = 0x40000000000000;
  slab_arena_create(&arena,&quota,0,4000000,2);
  slab_cache_create(&cache,&arena);
  plan(6);
  _space(_stdout);
  printf("# *** %s ***\n","test_ibuf_basic");
  ibuf_create(&local_60,&cache,0x3fc0);
  if (local_60.wpos < local_60.rpos) goto LAB_00103476;
  uVar5 = 0;
  _ok((uint)(local_60.wpos == local_60.rpos),"ibuf_used(&ibuf) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x14,
      "line %d",0x14);
  pcVar2 = local_60.wpos;
  if (local_60.end < local_60.wpos + 10) {
    pcVar2 = (char *)ibuf_reserve_slow(&local_60,10);
    if (pcVar2 != (char *)0x0) goto LAB_0010268b;
  }
  else {
LAB_0010268b:
    local_60.wpos = local_60.wpos + 10;
    uVar5 = (uint)(pcVar2 != (char *)0x0);
  }
  _ok(uVar5,"ptr != NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x16,
      "line %d",0x16);
  if (local_60.wpos < local_60.rpos) goto LAB_00103476;
  uVar5 = 0;
  _ok((uint)((long)local_60.wpos - (long)local_60.rpos == 10),"ibuf_used(&ibuf) == 10",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x17,
      "line %d",0x17);
  pcVar2 = local_60.wpos;
  if (local_60.end < local_60.wpos + 1000000) {
    pcVar2 = (char *)ibuf_reserve_slow(&local_60,1000000);
    if (pcVar2 != (char *)0x0) goto LAB_00102726;
  }
  else {
LAB_00102726:
    local_60.wpos = local_60.wpos + 1000000;
    uVar5 = (uint)(pcVar2 != (char *)0x0);
  }
  _ok(uVar5,"ptr != NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x1a,
      "line %d",0x1a);
  if (local_60.wpos < local_60.rpos) goto LAB_00103476;
  uVar5 = 0;
  _ok((uint)((long)local_60.wpos - (long)local_60.rpos == 0xf424a),"ibuf_used(&ibuf) == 1000010",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x1b,
      "line %d",0x1b);
  local_60.wpos = local_60.buf;
  local_60.rpos = local_60.buf;
  _ok(1,"ibuf_used(&ibuf) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x1e,
      "line %d",0x1e);
  ibuf_destroy(&local_60);
  _space(_stdout);
  printf("# *** %s: done ***\n","test_ibuf_basic");
  check_plan();
  plan(0xc);
  _space(_stdout);
  printf("# *** %s ***\n","test_ibuf_shrink");
  ibuf_create(&local_60,&cache,0x4000);
  pcVar2 = local_60.wpos;
  if (local_60.end < local_60.wpos + 0x19000) {
    pcVar2 = (char *)ibuf_reserve_slow(&local_60,0x19000);
    if (pcVar2 != (char *)0x0) goto LAB_0010286e;
  }
  else {
LAB_0010286e:
    local_60.wpos = local_60.wpos + 0x19000;
    uVar5 = (uint)(pcVar2 != (char *)0x0);
  }
  _ok(uVar5,"ibuf_alloc(&ibuf, 100 * 1024) != NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x2e,
      "line %d",0x2e);
  if (local_60.wpos < local_60.rpos) goto LAB_00103476;
  if ((ulong)((long)local_60.wpos - (long)local_60.rpos) < 0x11800) goto LAB_00103495;
  local_60.rpos = local_60.rpos + 0x11800;
  ibuf_shrink(&local_60);
  if (local_60.wpos < local_60.rpos) goto LAB_00103476;
  _ok((uint)((long)local_60.wpos - (long)local_60.rpos == 0x7800),
      "ibuf_used(&ibuf) == (100 - 70) * 1024",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x34,
      "line %d",0x34);
  if (local_60.wpos < local_60.rpos) goto LAB_00103476;
  _ok((uint)((ulong)((long)local_60.wpos - (long)local_60.rpos) <=
            (ulong)((long)local_60.end - (long)local_60.buf)),
      "ibuf_capacity(&ibuf) >= ibuf_used(&ibuf)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x35,
      "line %d",0x35);
  _ok((uint)((ulong)((long)local_60.end - (long)local_60.buf) < 0x10000),
      "ibuf_capacity(&ibuf) < start_capacity * 4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x36,
      "line %d",0x36);
  pcVar2 = local_60.buf;
  local_60.rpos = local_60.rpos + 1;
  ibuf_shrink(&local_60);
  _ok((uint)(pcVar2 == local_60.buf),"prev_buf == ibuf.buf",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x3e,
      "line %d",0x3e);
  if (local_60.wpos < local_60.rpos) goto LAB_00103476;
  if (local_60.wpos == local_60.rpos) goto LAB_00103495;
  local_60.rpos = local_60.wpos + -1;
  ibuf_shrink(&local_60);
  _ok((uint)(0x3fff < (ulong)((long)local_60.end - (long)local_60.buf)),
      "ibuf_capacity(&ibuf) >= start_capacity",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x44,
      "line %d",0x44);
  _ok((uint)((ulong)((long)local_60.end - (long)local_60.buf) < 0x8000),
      "ibuf_capacity(&ibuf) < start_capacity * 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x45,
      "line %d",0x45);
  if (local_60.wpos < local_60.rpos) goto LAB_00103476;
  local_60.rpos = local_60.wpos;
  ibuf_shrink(&local_60);
  uVar5 = 0;
  _ok((uint)(local_60.end == local_60.buf),"ibuf_capacity(&ibuf) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x4b,
      "line %d",0x4b);
  pcVar2 = local_60.wpos;
  if (local_60.end < local_60.wpos + 0x900000) {
    pcVar2 = (char *)ibuf_reserve_slow(&local_60,0x900000);
    if (pcVar2 != (char *)0x0) goto LAB_00102ae4;
  }
  else {
LAB_00102ae4:
    local_60.wpos = local_60.wpos + 0x900000;
    uVar5 = (uint)(pcVar2 != (char *)0x0);
  }
  _ok(uVar5,"ibuf_alloc(&ibuf, 9 * 1024 * 1024) != NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x50,
      "line %d",0x50);
  _ok((uint)((long)local_60.end - (long)local_60.buf == 0x1000000),
      "ibuf_capacity(&ibuf) == 16 * 1024 * 1024",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x51,
      "line %d",0x51);
  if (local_60.wpos < local_60.rpos) goto LAB_00103476;
  if ((ulong)((long)local_60.wpos - (long)local_60.rpos) < 0x200000) goto LAB_00103495;
  local_60.rpos = local_60.rpos + 0x200000;
  ibuf = &local_60;
  ibuf_shrink(ibuf);
  _ok((uint)((long)local_60.end - (long)local_60.buf == 0x700000),
      "ibuf_capacity(&ibuf) == 7 * 1024 * 1024",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x54,
      "line %d",0x54);
  pcVar2 = local_60.buf;
  ibuf_shrink(ibuf);
  _ok((uint)(pcVar2 == local_60.buf),"prev_buf == ibuf.buf",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x5b,
      "line %d",0x5b);
  ibuf_destroy(ibuf);
  _space(_stdout);
  printf("# *** %s: done ***\n","test_ibuf_shrink");
  check_plan();
  plan(4);
  _space(_stdout);
  printf("# *** %s ***\n","test_ibuf_truncate");
  psVar6 = &cache;
  ibuf_create(ibuf,&cache,0x4000);
  if (local_60.end < local_60.wpos + 10) {
    ibuf = &local_60;
    psVar6 = (slab_cache *)0xa;
    pvVar3 = ibuf_reserve_slow(ibuf,10);
    pcVar2 = (char *)psVar6;
    if (pvVar3 != (void *)0x0) goto LAB_00102c88;
  }
  else {
LAB_00102c88:
    local_60.wpos = local_60.wpos + 10;
    pcVar2 = (char *)psVar6;
  }
  if (local_60.wpos < local_60.rpos) goto LAB_00103476;
  if ((ulong)((long)local_60.wpos - (long)local_60.rpos) < 10) goto LAB_00103495;
  local_60.rpos = local_60.rpos + 10;
  pcVar4 = local_60.wpos;
  if (local_60.end < local_60.wpos + 0xc) {
    ibuf = &local_60;
    pcVar2 = (char *)0xc;
    pcVar4 = (char *)ibuf_reserve_slow(ibuf,0xc);
    if (pcVar4 != (char *)0x0) goto LAB_00102cd4;
    pcVar4 = (char *)0x0;
  }
  else {
LAB_00102cd4:
    local_60.wpos = local_60.wpos + 0xc;
  }
  if (pcVar4 == (char *)0x0) {
    main_cold_3();
  }
  else {
    builtin_strncpy(pcVar4,"Hello Hello",0xc);
    uVar8 = (long)local_60.wpos - (long)local_60.rpos;
    if (local_60.wpos < local_60.rpos) goto LAB_00103476;
    pcVar4 = local_60.wpos;
    if (local_60.end < local_60.wpos + 100) {
      ibuf = &local_60;
      pcVar2 = (char *)0x64;
      pcVar4 = (char *)ibuf_reserve_slow(ibuf,100);
      if (pcVar4 != (char *)0x0) goto LAB_00102d28;
      pcVar4 = (char *)0x0;
    }
    else {
LAB_00102d28:
      local_60.wpos = local_60.wpos + 100;
    }
    if (pcVar4 != (char *)0x0) {
      builtin_strncpy(pcVar4,"Goodbye",8);
      if (local_60.wpos < local_60.rpos) goto LAB_00103476;
      lVar7 = uVar8 - ((long)local_60.wpos - (long)local_60.rpos);
      if ((ulong)((long)local_60.wpos - (long)local_60.rpos) <= uVar8 && lVar7 != 0)
      goto LAB_001034b4;
      local_60.wpos = local_60.wpos + lVar7;
      if (local_60.wpos < local_60.rpos) goto LAB_00103476;
      _ok((uint)((long)local_60.wpos - (long)local_60.rpos == uVar8),"ibuf_used(&ibuf) == svp",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x7c,
          "line %d",0x7c);
      iVar1 = strcmp(local_60.rpos,"Hello Hello");
      ibuf = (ibuf *)(ulong)(iVar1 == 0);
      pcVar2 = "strcmp(ibuf.rpos, hello) == 0";
      _ok((uint)(iVar1 == 0),"strcmp(ibuf.rpos, hello) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x7d,
          "line %d",0x7d);
      pcVar4 = local_60.wpos;
      if (local_60.end < local_60.wpos + 0x8000) {
        ibuf = &local_60;
        pcVar2 = (char *)0x8000;
        pcVar4 = (char *)ibuf_reserve_slow(ibuf,0x8000);
        if (pcVar4 != (char *)0x0) goto LAB_00102e08;
        pcVar4 = (char *)0x0;
      }
      else {
LAB_00102e08:
        local_60.wpos = local_60.wpos + 0x8000;
      }
      if (pcVar4 == (char *)0x0) goto LAB_0010351b;
      builtin_strncpy(pcVar4,"Goodbye",8);
      if (local_60.wpos < local_60.rpos) goto LAB_00103476;
      lVar7 = uVar8 - ((long)local_60.wpos - (long)local_60.rpos);
      if ((ulong)((long)local_60.wpos - (long)local_60.rpos) <= uVar8 && lVar7 != 0) {
LAB_001034b4:
        __assert_fail("used <= ibuf_used(ibuf)",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/ibuf.h"
                      ,0xcf,"void ibuf_truncate(struct ibuf *, size_t)");
      }
      local_60.wpos = local_60.wpos + lVar7;
      if (local_60.wpos < local_60.rpos) goto LAB_00103476;
      _ok((uint)((long)local_60.wpos - (long)local_60.rpos == uVar8),"ibuf_used(&ibuf) == svp",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x86,
          "line %d",0x86);
      iVar1 = strcmp(local_60.rpos,"Hello Hello");
      _ok((uint)(iVar1 == 0),"strcmp(ibuf.rpos, hello) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x87,
          "line %d",0x87);
      ibuf_destroy(&local_60);
      _space(_stdout);
      printf("# *** %s: done ***\n","test_ibuf_truncate");
      check_plan();
      plan(4);
      _space(_stdout);
      printf("# *** %s ***\n","test_ibuf_discard");
      ibuf_create(&local_60,&cache,0x400);
      if (local_60.end < local_60.wpos + 0x200) {
        pvVar3 = ibuf_reserve_slow(&local_60,0x200);
        if (pvVar3 != (void *)0x0) goto LAB_00102f4a;
      }
      else {
LAB_00102f4a:
        local_60.wpos = local_60.wpos + 0x200;
      }
      pcVar2 = local_60.rpos;
      if (local_60.wpos < local_60.rpos) goto LAB_00103476;
      if ((ulong)((long)local_60.wpos - (long)local_60.rpos) < 100) {
LAB_001034d3:
        __assert_fail("size <= ibuf_used(ibuf)",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/ibuf.h"
                      ,0xc2,"void ibuf_discard(struct ibuf *, size_t)");
      }
      local_60.wpos = local_60.wpos + -100;
      _ok(1,"ibuf.rpos == pos",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x99,
          "line %d",0x99);
      if (local_60.wpos < local_60.rpos) goto LAB_00103476;
      _ok((uint)((long)local_60.wpos - (long)local_60.rpos == 0x19c),"ibuf_used(&ibuf) == 412",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x9a,
          "line %d",0x9a);
      if (local_60.wpos < local_60.rpos) goto LAB_00103476;
      if ((ulong)((long)local_60.wpos - (long)local_60.rpos) < 0x19c) goto LAB_001034d3;
      local_60.wpos = local_60.wpos + -0x19c;
      _ok((uint)(local_60.rpos == pcVar2),"ibuf.rpos == pos",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x9c,
          "line %d",0x9c);
      if (local_60.wpos < local_60.rpos) goto LAB_00103476;
      _ok((uint)(local_60.wpos == local_60.rpos),"ibuf_used(&ibuf) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x9d,
          "line %d",0x9d);
      ibuf_destroy(&local_60);
      _space(_stdout);
      printf("# *** %s: done ***\n","test_ibuf_discard");
      check_plan();
      plan(4);
      _space(_stdout);
      printf("# *** %s ***\n","test_ibuf_consume");
      ibuf_create(&local_60,&cache,0x400);
      if (local_60.end < local_60.wpos + 0x200) {
        pvVar3 = ibuf_reserve_slow(&local_60,0x200);
        if (pvVar3 != (void *)0x0) goto LAB_0010310a;
      }
      else {
LAB_0010310a:
        local_60.wpos = local_60.wpos + 0x200;
      }
      pcVar2 = local_60.wpos;
      if (local_60.wpos < local_60.rpos) goto LAB_00103476;
      if ((ulong)((long)local_60.wpos - (long)local_60.rpos) < 200) goto LAB_00103495;
      local_60.rpos = local_60.rpos + 200;
      _ok(1,"ibuf.wpos == pos",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0xaf,
          "line %d",0xaf);
      if (local_60.wpos < local_60.rpos) goto LAB_00103476;
      _ok((uint)((long)local_60.wpos - (long)local_60.rpos == 0x138),"ibuf_used(&ibuf) == 312",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0xb0,
          "line %d",0xb0);
      if (local_60.wpos < local_60.rpos) goto LAB_00103476;
      if ((ulong)((long)local_60.wpos - (long)local_60.rpos) < 0x138) goto LAB_00103495;
      local_60.rpos = local_60.rpos + 0x138;
      _ok((uint)(local_60.wpos == pcVar2),"ibuf.wpos == pos",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0xb2,
          "line %d",0xb2);
      if (local_60.wpos < local_60.rpos) goto LAB_00103476;
      _ok((uint)(local_60.wpos == local_60.rpos),"ibuf_used(&ibuf) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0xb3,
          "line %d",0xb3);
      ibuf_destroy(&local_60);
      _space(_stdout);
      printf("# *** %s: done ***\n","test_ibuf_consume");
      check_plan();
      plan(4);
      _space(_stdout);
      printf("# *** %s ***\n","test_ibuf_consume_before");
      ibuf_create(&local_60,&cache,0x400);
      if (local_60.end < local_60.wpos + 5000) {
        pvVar3 = ibuf_reserve_slow(&local_60,5000);
        if (pvVar3 != (void *)0x0) goto LAB_001032cf;
      }
      else {
LAB_001032cf:
        local_60.wpos = local_60.wpos + 5000;
      }
      pcVar2 = local_60.wpos;
      if (local_60.rpos <= local_60.wpos + -1000) {
        if (local_60.rpos <= local_60.wpos) {
          uVar8 = (long)(local_60.wpos + -1000) - (long)local_60.rpos;
          if ((ulong)((long)local_60.wpos - (long)local_60.rpos) < uVar8) {
LAB_00103495:
            __assert_fail("size <= ibuf_used(ibuf)",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/ibuf.h"
                          ,0xd7,"void ibuf_consume(struct ibuf *, size_t)");
          }
          local_60.rpos = local_60.rpos + uVar8;
          _ok(1,"ibuf.wpos == pos",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0xc5
              ,"line %d",0xc5);
          if (local_60.rpos <= local_60.wpos) {
            _ok((uint)((long)local_60.wpos - (long)local_60.rpos == 1000),"ibuf_used(&ibuf) == 1000"
                ,"/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",
                0xc6,"line %d",0xc6);
            if (local_60.wpos < local_60.rpos) goto LAB_001034f2;
            local_60.rpos = local_60.wpos;
            _ok((uint)(local_60.wpos == pcVar2),"ibuf.wpos == pos",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",
                200,"line %d",200);
            if (local_60.rpos <= local_60.wpos) {
              _ok((uint)(local_60.wpos == local_60.rpos),"ibuf_used(&ibuf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",
                  0xc9,"line %d",0xc9);
              ibuf_destroy(&local_60);
              _space(_stdout);
              printf("# *** %s: done ***\n","test_ibuf_consume_before");
              check_plan();
              slab_cache_destroy(&cache);
              _space(_stdout);
              printf("# *** %s: done ***\n","main");
              iVar1 = check_plan();
              return iVar1;
            }
          }
        }
LAB_00103476:
        __assert_fail("ibuf->wpos >= ibuf->rpos",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/ibuf.h"
                      ,0x56,"size_t ibuf_used(struct ibuf *)");
      }
LAB_001034f2:
      __assert_fail("(const char *)ptr >= ibuf->rpos",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/ibuf.h"
                    ,0xe0,"void ibuf_consume_before(struct ibuf *, const void *)");
    }
  }
  main_cold_2();
LAB_0010351b:
  main_cold_1();
  ibuf->slabc = (slab_cache *)pcVar2;
  ibuf->buf = (char *)0x0;
  ibuf->rpos = (char *)0x0;
  ibuf->wpos = (char *)0x0;
  ibuf->end = (char *)0x0;
  ibuf->start_capacity = extraout_RDX;
  return extraout_EAX;
}

Assistant:

int main()
{
#ifdef ENABLE_ASAN
	plan(7);
#else
	plan(6);
#endif
	header();

	quota_init(&quota, UINT_MAX);
	slab_arena_create(&arena, &quota, 0,
			  4000000, MAP_PRIVATE);
	slab_cache_create(&cache, &arena);

	test_ibuf_basic();
	test_ibuf_shrink();
	test_ibuf_truncate();
	test_ibuf_discard();
	test_ibuf_consume();
	test_ibuf_consume_before();
#ifdef ENABLE_ASAN
	test_ibuf_poison();
#endif

	slab_cache_destroy(&cache);

	footer();
	return check_plan();
}